

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O0

int __thiscall Relation::rename(Relation *this,char *__old,char *__new)

{
  bool bVar1;
  reference pTVar2;
  Tuple local_98;
  undefined1 local_80 [8];
  Tuple t;
  iterator __end1;
  iterator __begin1;
  set<Tuple,_tupleCompare,_std::allocator<Tuple>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  undefined1 local_21;
  char *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *newNames_local;
  Relation *this_local;
  Relation *res;
  
  local_21 = 0;
  local_20 = __new;
  newNames_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)__old;
  this_local = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_40,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__new);
  Relation(this,&local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_40);
  __end1 = std::set<Tuple,_tupleCompare,_std::allocator<Tuple>_>::begin
                     ((set<Tuple,_tupleCompare,_std::allocator<Tuple>_> *)(__old + 0x18));
  t.data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::set<Tuple,_tupleCompare,_std::allocator<Tuple>_>::end
                          ((set<Tuple,_tupleCompare,_std::allocator<Tuple>_> *)(__old + 0x18));
  while (bVar1 = std::operator!=(&__end1,(_Self *)&t.data.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                ), bVar1) {
    pTVar2 = std::_Rb_tree_const_iterator<Tuple>::operator*(&__end1);
    Tuple::Tuple((Tuple *)local_80,pTVar2);
    Tuple::Tuple(&local_98,(Tuple *)local_80);
    add(this,&local_98);
    Tuple::~Tuple(&local_98);
    Tuple::~Tuple((Tuple *)local_80);
    std::_Rb_tree_const_iterator<Tuple>::operator++(&__end1);
  }
  return (int)this;
}

Assistant:

Relation Relation::rename(vector<string> newNames)
{
 Relation res = Relation(newNames);
 for (auto t: tuples)
 {
   res.add(t);
 }
 return res;
}